

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::operator()
          (Comparator<Corrade::TestSuite::Compare::File> *this,StringView actualFilename,
          StringView expectedFilename)

{
  char cVar1;
  State *pSVar2;
  UnderlyingType UVar3;
  Optional<Corrade::Containers::String> actualContents;
  Optional<Corrade::Containers::String> expectedContents;
  Optional<Corrade::Containers::String> OStack_c8;
  Optional<Corrade::Containers::String> local_a8;
  undefined1 local_88 [40];
  undefined1 local_60 [24];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  pSVar2 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  Corrade::Utility::Path::join
            (&OStack_c8,(pSVar2->pathPrefix)._data,(pSVar2->pathPrefix)._sizePlusFlags,
             actualFilename._data,actualFilename._sizePlusFlags);
  pSVar2 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  Corrade::Containers::String::operator=(&pSVar2->actualFilename,(String *)&OStack_c8);
  Corrade::Containers::String::~String((String *)&OStack_c8);
  pSVar2 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  Corrade::Utility::Path::join
            (&OStack_c8,(pSVar2->pathPrefix)._data,(pSVar2->pathPrefix)._sizePlusFlags,
             expectedFilename._data,expectedFilename._sizePlusFlags);
  pSVar2 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  Corrade::Containers::String::operator=(&pSVar2->expectedFilename,(String *)&OStack_c8);
  Corrade::Containers::String::~String((String *)&OStack_c8);
  Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
  operator->(&this->_state);
  Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)(local_60 + 0x20));
  Corrade::Utility::Path::readString(&OStack_c8,local_40,local_38);
  UVar3 = '\x01';
  if (OStack_c8._set != false) {
    Containers::Optional<Corrade::Containers::String>::operator*((String *)&local_a8,&OStack_c8);
    pSVar2 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    Corrade::Containers::String::operator=(&pSVar2->actualContents,(String *)&local_a8);
    Corrade::Containers::String::~String((String *)&local_a8);
    pSVar2 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    pSVar2->actualResult = Success;
    Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
    operator->(&this->_state);
    Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)(local_60 + 0x10));
    Corrade::Utility::Path::readString(&local_a8,local_60._16_8_,local_48);
    UVar3 = '\x11';
    if (local_a8._set != false) {
      Containers::Optional<Corrade::Containers::String>::operator*
                ((String *)(local_88 + 0x10),&local_a8);
      pSVar2 = Containers::
               Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
               operator->(&this->_state);
      Corrade::Containers::String::operator=(&pSVar2->expectedContents,(String *)(local_88 + 0x10));
      Corrade::Containers::String::~String((String *)(local_88 + 0x10));
      pSVar2 = Containers::
               Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
               operator->(&this->_state);
      pSVar2->expectedResult = Success;
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)local_88);
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)local_60);
      cVar1 = Corrade::Containers::operator==(local_88._0_8_,local_88._8_8_,local_60._0_8_);
      UVar3 = '\x11';
      if (cVar1 != '\0') {
        UVar3 = '\0';
      }
    }
    if (local_a8._set == true) {
      Corrade::Containers::String::~String((String *)&local_a8);
    }
  }
  if (OStack_c8._set == true) {
    Corrade::Containers::String::~String((String *)&OStack_c8);
  }
  return (ComparisonStatusFlags)UVar3;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::File>::operator()(const Containers::StringView actualFilename, const Containers::StringView expectedFilename) {
    _state->actualFilename = Utility::Path::join(_state->pathPrefix, actualFilename);
    _state->expectedFilename = Utility::Path::join(_state->pathPrefix, expectedFilename);

    /* Read the actual file contents before the expected so if the expected
       file can't be read, we can still save actual file contents */
    Containers::Optional<Containers::String> actualContents = Utility::Path::readString(_state->actualFilename);
    if(!actualContents)
        return ComparisonStatusFlag::Failed;

    _state->actualContents = *Utility::move(actualContents);
    _state->actualResult = Result::Success;

    /* If this fails, we already have the actual contents so we can save them */
    Containers::Optional<Containers::String> expectedContents = Utility::Path::readString(_state->expectedFilename);
    if(!expectedContents)
        return ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;

    _state->expectedContents = *Utility::move(expectedContents);
    _state->expectedResult = Result::Success;

    return _state->actualContents == _state->expectedContents ? ComparisonStatusFlags{} :
        ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;
}